

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O1

void sha256_update(sha256_t *p,uchar *data,size_t size)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  
  if (size != 0) {
    uVar1 = (uint)p->count & 0x3f;
    sVar3 = 0;
    do {
      uVar2 = (ulong)uVar1;
      uVar1 = uVar1 + 1;
      p->buffer[uVar2] = data[sVar3];
      p->count = p->count + 1;
      if (uVar1 == 0x40) {
        sha256_write_byte_block(p);
        uVar1 = 0;
      }
      sVar3 = sVar3 + 1;
    } while (size != sVar3);
  }
  return;
}

Assistant:

void
sha256_update(sha256_t *p, const unsigned char *data, size_t size)
{
  uint32_t curBufferPos = (uint32_t)p->count & 0x3F;
  while (size > 0)
  {
    p->buffer[curBufferPos++] = *data++;
    p->count++;
    size--;
    if (curBufferPos == 64)
    {
      curBufferPos = 0;
      sha256_write_byte_block(p);
    }
  }
}